

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O2

void __thiscall
JPolComponent_VectorImplementation::ZeroInitialization
          (JPolComponent_VectorImplementation *this,Index agI)

{
  PolicyPureVector *this_00;
  E *this_01;
  
  this_00 = (this->_m_indivPols_PolicyPureVector).
            super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
            super__Vector_impl_data._M_start[agI];
  if (this_00 != (PolicyPureVector *)0x0) {
    PolicyPureVector::ZeroInitialization(this_00);
    return;
  }
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01," JPolComponent_VectorImplementation::ZeroInitialization(agI) this_pol is 0!?");
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

void JPolComponent_VectorImplementation::ZeroInitialization(Index agI)
{
    PolicyPureVector* this_pol = this->_m_indivPols_PolicyPureVector[agI];
    if(this_pol == 0) 
    {
        throw E(" JPolComponent_VectorImplementation::ZeroInitialization(agI) this_pol is 0!?");
    }
    this_pol->ZeroInitialization();
}